

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule(cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  bool bVar1;
  TargetType TVar2;
  TargetType targetType_00;
  int iVar3;
  cmGeneratorTarget *pcVar4;
  cmGlobalNinjaGenerator *pcVar5;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar6;
  char *pcVar7;
  undefined4 extraout_var;
  pointer this_01;
  ostream *poVar8;
  string *source;
  cmOutputConverter *local_f00;
  allocator<char> local_e21;
  string local_e20;
  allocator<char> local_df9;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0;
  allocator<char> local_da9;
  string local_da8;
  allocator<char> local_d81;
  string local_d80;
  allocator<char> local_d59;
  string local_d58;
  allocator<char> local_d31;
  string local_d30;
  string local_d10;
  string local_cf0;
  allocator<char> local_cc9;
  string local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  undefined1 local_c88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandLines_1;
  string local_c68;
  allocator<char> local_c41;
  string local_c40;
  allocator<char> local_c19;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  allocator<char> local_b79;
  string local_b78;
  string local_b58;
  string local_b38;
  allocator<char> local_b11;
  string local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  undefined1 local_ad0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandLines;
  string cmakeCommand;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  string local_a20;
  string local_a00;
  undefined1 local_9e0 [8];
  ostringstream description;
  undefined1 local_868 [8];
  ostringstream comment;
  string local_6f0;
  undefined1 local_6d0 [8];
  string linkCmd;
  allocator<char> local_6a1;
  value_type local_6a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_680;
  const_iterator local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  reference local_648;
  string *linkCmd_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_600;
  char *local_5e0;
  char *val;
  string launcher;
  string langFlags;
  string local_578 [32];
  int local_558;
  int local_554;
  int minor;
  int major;
  ostringstream minorStream;
  ostringstream local_3d8 [8];
  ostringstream majorStream;
  string local_260 [8];
  string targetVersionMinor;
  string targetVersionMajor;
  char *flag;
  string cmakeLinkVar;
  undefined1 local_1f0 [8];
  string cmakeVarLang;
  string responseFlag;
  RuleVariables vars;
  undefined1 local_78 [8];
  string rspcontent;
  string rspfile;
  string ruleName;
  TargetType targetType;
  bool useResponseFile_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TVar2 = cmGeneratorTarget::GetType(pcVar4);
  LanguageLinkerRule_abi_cxx11_((string *)((long)&rspfile.field_2 + 8),this);
  std::__cxx11::string::string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGlobalNinjaGenerator::HasRule(pcVar5,(string *)((long)&rspfile.field_2 + 8));
  if (!bVar1) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&responseFlag.field_2 + 8));
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
    responseFlag.field_2._8_8_ = std::__cxx11::string::c_str();
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    targetType_00 = cmGeneratorTarget::GetType(pcVar4);
    cmState::GetTargetTypeName(targetType_00);
    std::__cxx11::string::c_str();
    std::operator==(&this->TargetLinkLanguage,"Swift");
    std::__cxx11::string::string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    if (useResponseFile) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f0,"CMAKE_",
                 (allocator<char> *)(cmakeLinkVar.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(cmakeLinkVar.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::operator+=((string *)local_1f0,(string *)&this->TargetLinkLanguage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     "_RESPONSE_FILE_LINK_FLAG");
      this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
      pcVar7 = cmMakefile::GetDefinition(this_00,(string *)&flag);
      if (pcVar7 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),"@");
      }
      else {
        std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),pcVar7);
      }
      std::__cxx11::string::operator=((string *)(rspcontent.field_2._M_local_buf + 8),"$RSP_FILE");
      std::__cxx11::string::operator+=
                ((string *)(cmakeVarLang.field_2._M_local_buf + 8),
                 (string *)(rspcontent.field_2._M_local_buf + 8));
      pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar5);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_78,"$in");
      }
      else {
        std::__cxx11::string::operator=((string *)local_78,"$in_newline");
      }
      std::__cxx11::string::operator+=((string *)local_78," $LINK_PATH $LINK_LIBRARIES");
      std::__cxx11::string::c_str();
      std::__cxx11::string::~string((string *)&flag);
      std::__cxx11::string::~string((string *)local_1f0);
    }
    std::__cxx11::string::string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_260);
    std::__cxx11::ostringstream::ostringstream(local_3d8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&minor);
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetTargetVersion(pcVar4,&local_554,&local_558);
    std::ostream::operator<<(local_3d8,local_554);
    std::ostream::operator<<(&minor,local_558);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)(targetVersionMinor.field_2._M_local_buf + 8),local_578);
    std::__cxx11::string::~string(local_578);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_260,(string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&minor);
    std::__cxx11::ostringstream::~ostringstream(local_3d8);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)(launcher.field_2._M_local_buf + 8));
    if (TVar2 != EXECUTABLE) {
      std::__cxx11::string::operator+=
                ((string *)(launcher.field_2._M_local_buf + 8),"$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS"
                );
      std::__cxx11::string::c_str();
    }
    std::__cxx11::string::string((string *)&val);
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"RULE_LAUNCH_LINK",
               (allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    pcVar7 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar6,pcVar4,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    local_5e0 = pcVar7;
    if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
      std::__cxx11::string::operator=((string *)&val,pcVar7);
      std::__cxx11::string::operator+=((string *)&val," ");
    }
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    iVar3 = (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&linkCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (pointer)CONCAT44(extraout_var,iVar3));
    ComputeLinkCmd_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,this);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    linkCmd_1 = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&linkCmd_1), bVar1) {
      local_648 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      std::operator+(&local_668,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     local_648);
      std::__cxx11::string::operator=((string *)local_648,(string *)&local_668);
      std::__cxx11::string::~string((string *)&local_668);
      this_01 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&linkCmds.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      local_f00 = (cmOutputConverter *)0x0;
      if (pcVar6 != (cmLocalNinjaGenerator *)0x0) {
        local_f00 = &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_01,local_f00,local_648,(RuleVariables *)((long)&responseFlag.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&__range2);
    local_680._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_678,&local_680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"$PRE_LINK",&local_6a1);
    linkCmd.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2,local_678,&local_6a0);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator(&local_6a1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
               (char (*) [12])"$POST_BUILD");
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::string::string((string *)&local_6f0);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_6d0,pcVar6,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,&local_6f0,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_868);
    poVar8 = std::operator<<((ostream *)local_868,"Rule for linking ");
    poVar8 = std::operator<<(poVar8,(string *)&this->TargetLinkLanguage);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = GetVisibleTypeName(this);
    poVar8 = std::operator<<(poVar8,pcVar7);
    std::operator<<(poVar8,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9e0);
    poVar8 = std::operator<<((ostream *)local_9e0,"Linking ");
    poVar8 = std::operator<<(poVar8,(string *)&this->TargetLinkLanguage);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = GetVisibleTypeName(this);
    poVar8 = std::operator<<(poVar8,pcVar7);
    std::operator<<(poVar8," $TARGET_FILE");
    pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a40,"",&local_a41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a68,"",&local_a69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a90,"$RESTAT",
               (allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
    cmGlobalNinjaGenerator::AddRule
              (pcVar5,(string *)((long)&rspfile.field_2 + 8),(string *)local_6d0,&local_a00,
               &local_a20,&local_a40,&local_a68,(string *)((long)&rspcontent.field_2 + 8),
               (string *)local_78,&local_a90,false);
    std::__cxx11::string::~string((string *)&local_a90);
    std::allocator<char>::~allocator((allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_a68);
    std::allocator<char>::~allocator(&local_a69);
    std::__cxx11::string::~string((string *)&local_a40);
    std::allocator<char>::~allocator(&local_a41);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::string::~string((string *)&local_a00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_868);
    std::__cxx11::string::~string((string *)local_6d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&linkCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
  }
  bVar1 = std::operator!=(&(this->TargetNames).Output,&(this->TargetNames).Real);
  if (bVar1) {
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::IsFrameworkOnApple(pcVar4);
    if (!bVar1) {
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      source = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                ((string *)
                 &commandLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      if (TVar2 == EXECUTABLE) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_ad0);
        std::operator+(&local_af0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &commandLines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       " -E cmake_symlink_executable $in $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_ad0,&local_af0);
        std::__cxx11::string::~string((string *)&local_af0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[12]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_ad0,
                   (char (*) [12])"$POST_BUILD");
        pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b10,"CMAKE_SYMLINK_EXECUTABLE",&local_b11);
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        std::__cxx11::string::string((string *)&local_b58);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_b38,pcVar6,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_ad0,&local_b58,(cmGeneratorTarget *)0x0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b78,"Creating executable symlink $out",&local_b79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ba0,"Rule for creating executable symlink.",&local_ba1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc8,"",&local_bc9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_bf0,"",&local_bf1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"",&local_c19);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c40,"",&local_c41);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c68,"",
                   (allocator<char> *)
                   ((long)&commandLines_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmGlobalNinjaGenerator::AddRule
                  (pcVar5,&local_b10,&local_b38,&local_b78,&local_ba0,&local_bc8,&local_bf0,
                   &local_c18,&local_c40,&local_c68,false);
        std::__cxx11::string::~string((string *)&local_c68);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&commandLines_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_c40);
        std::allocator<char>::~allocator(&local_c41);
        std::__cxx11::string::~string((string *)&local_c18);
        std::allocator<char>::~allocator(&local_c19);
        std::__cxx11::string::~string((string *)&local_bf0);
        std::allocator<char>::~allocator(&local_bf1);
        std::__cxx11::string::~string((string *)&local_bc8);
        std::allocator<char>::~allocator(&local_bc9);
        std::__cxx11::string::~string((string *)&local_ba0);
        std::allocator<char>::~allocator(&local_ba1);
        std::__cxx11::string::~string((string *)&local_b78);
        std::allocator<char>::~allocator(&local_b79);
        std::__cxx11::string::~string((string *)&local_b38);
        std::__cxx11::string::~string((string *)&local_b58);
        std::__cxx11::string::~string((string *)&local_b10);
        std::allocator<char>::~allocator(&local_b11);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_ad0);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c88);
        std::operator+(&local_ca8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &commandLines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       " -E cmake_symlink_library $in $SONAME $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c88,&local_ca8);
        std::__cxx11::string::~string((string *)&local_ca8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[12]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_c88,
                   (char (*) [12])"$POST_BUILD");
        pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_cc8,"CMAKE_SYMLINK_LIBRARY",&local_cc9);
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        std::__cxx11::string::string((string *)&local_d10);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_cf0,pcVar6,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c88,&local_d10,(cmGeneratorTarget *)0x0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d30,"Creating library symlink $out",&local_d31);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d58,"Rule for creating library symlink.",&local_d59);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d80,"",&local_d81);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_da8,"",&local_da9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd0,"",&local_dd1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_df8,"",&local_df9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e20,"",&local_e21);
        cmGlobalNinjaGenerator::AddRule
                  (pcVar5,&local_cc8,&local_cf0,&local_d30,&local_d58,&local_d80,&local_da8,
                   &local_dd0,&local_df8,&local_e20,false);
        std::__cxx11::string::~string((string *)&local_e20);
        std::allocator<char>::~allocator(&local_e21);
        std::__cxx11::string::~string((string *)&local_df8);
        std::allocator<char>::~allocator(&local_df9);
        std::__cxx11::string::~string((string *)&local_dd0);
        std::allocator<char>::~allocator(&local_dd1);
        std::__cxx11::string::~string((string *)&local_da8);
        std::allocator<char>::~allocator(&local_da9);
        std::__cxx11::string::~string((string *)&local_d80);
        std::allocator<char>::~allocator(&local_d81);
        std::__cxx11::string::~string((string *)&local_d58);
        std::allocator<char>::~allocator(&local_d59);
        std::__cxx11::string::~string((string *)&local_d30);
        std::allocator<char>::~allocator(&local_d31);
        std::__cxx11::string::~string((string *)&local_cf0);
        std::__cxx11::string::~string((string *)&local_d10);
        std::__cxx11::string::~string((string *)&local_cc8);
        std::allocator<char>::~allocator(&local_cc9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c88);
      }
      std::__cxx11::string::~string
                ((string *)
                 &commandLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rspfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();
  std::string ruleName = this->LanguageLinkerRule();

  // Select whether to use a response file for objects.
  std::string rspfile;
  std::string rspcontent;

  if (!this->GetGlobalGenerator()->HasRule(ruleName)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = this->TargetLinkLanguage.c_str();
    if (this->TargetLinkLanguage == "Swift") {
      vars.SwiftPartialModules = "$SWIFT_PARTIAL_MODULES";
      vars.TargetSwiftModule = "$TARGET_SWIFT_MODULE";
      vars.TargetSwiftDoc = "$TARGET_SWIFT_DOC";
    }

    std::string responseFlag;
    if (!useResponseFile) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      std::string cmakeVarLang = "CMAKE_";
      cmakeVarLang += this->TargetLinkLanguage;

      // build response file name
      std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
      const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);
      if (flag) {
        responseFlag = flag;
      } else {
        responseFlag = "@";
      }
      rspfile = "$RSP_FILE";
      responseFlag += rspfile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rspcontent = "$in";
      } else {
        rspcontent = "$in_newline";
      }
      rspcontent += " $LINK_PATH $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = launcher + linkCmd;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    std::string linkCmd =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    std::ostringstream comment;
    comment << "Rule for linking " << this->TargetLinkLanguage << " "
            << this->GetVisibleTypeName() << ".";
    std::ostringstream description;
    description << "Linking " << this->TargetLinkLanguage << " "
                << this->GetVisibleTypeName() << " $TARGET_FILE";
    this->GetGlobalGenerator()->AddRule(ruleName, linkCmd, description.str(),
                                        comment.str(),
                                        /*depfile*/ "",
                                        /*deptype*/ "", rspfile, rspcontent,
                                        /*restat*/ "$RESTAT",
                                        /*generator*/ false);
  }

  if (this->TargetNames.Output != this->TargetNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      std::vector<std::string> commandLines;
      commandLines.push_back(cmakeCommand +
                             " -E cmake_symlink_executable $in $out");
      commandLines.emplace_back("$POST_BUILD");

      this->GetGlobalGenerator()->AddRule(
        "CMAKE_SYMLINK_EXECUTABLE",
        this->GetLocalGenerator()->BuildCommandLine(commandLines),
        "Creating executable symlink $out",
        "Rule for creating "
        "executable symlink.",
        /*depfile*/ "",
        /*deptype*/ "",
        /*rspfile*/ "",
        /*rspcontent*/ "",
        /*restat*/ "",
        /*generator*/ false);
    } else {
      std::vector<std::string> commandLines;
      commandLines.push_back(cmakeCommand +
                             " -E cmake_symlink_library $in $SONAME $out");
      commandLines.emplace_back("$POST_BUILD");

      this->GetGlobalGenerator()->AddRule(
        "CMAKE_SYMLINK_LIBRARY",
        this->GetLocalGenerator()->BuildCommandLine(commandLines),
        "Creating library symlink $out",
        "Rule for creating "
        "library symlink.",
        /*depfile*/ "",
        /*deptype*/ "",
        /*rspfile*/ "",
        /*rspcontent*/ "",
        /*restat*/ "",
        /*generator*/ false);
    }
  }
}